

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::SetTest(cmCTest *this,char *ttype,bool report)

{
  bool bVar1;
  Part PVar2;
  long lVar3;
  ostream *poVar4;
  allocator local_1c1;
  string local_1c0;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string((string *)&local_1c0,ttype,&local_1c1);
  cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,&local_1c0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &cmCTestLog_msg,"all");
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (bVar1) {
    for (lVar3 = 0; lVar3 != 0x2c0; lVar3 = lVar3 + 0x40) {
      (&this->Parts[0].Enabled)[lVar3] = true;
    }
  }
  else {
    PVar2 = GetPartFromName(this,ttype);
    if (PVar2 == PartCount) {
      if (report) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Don\'t know about test \"");
        poVar4 = std::operator<<(poVar4,ttype);
        poVar4 = std::operator<<(poVar4,"\" yet...");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x2e2,local_1c0._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      return false;
    }
    this->Parts[PVar2].Enabled = true;
  }
  return true;
}

Assistant:

bool cmCTest::SetTest(const char* ttype, bool report)
{
  if (cmSystemTools::LowerCase(ttype) == "all") {
    for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
      this->Parts[p].Enable();
    }
    return true;
  }
  Part p = this->GetPartFromName(ttype);
  if (p != PartCount) {
    this->Parts[p].Enable();
    return true;
  }
  if (report) {
    cmCTestLog(this, ERROR_MESSAGE, "Don't know about test \""
                 << ttype << "\" yet..." << std::endl);
  }
  return false;
}